

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O3

void Gia_ManSuperCollectAnd_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  Gia_Obj_t *pGVar1;
  ulong uVar2;
  int iVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  int iVar6;
  
  uVar2 = (ulong)pObj & 1;
  while (uVar2 == 0) {
    iVar3 = 0;
    uVar5 = (uint)*(undefined8 *)pObj;
    iVar6 = 0;
    if ((((int)uVar5 < 0) || (iVar6 = iVar3, (uVar5 & 0x1fffffff) == 0x1fffffff)) ||
       ((uVar5 & 0x1fffffff) <= ((uint)((ulong)*(undefined8 *)pObj >> 0x20) & 0x1fffffff)))
    goto LAB_0072ddf0;
    pGVar1 = p->pObjs;
    if ((pObj < pGVar1) || (pGVar1 + p->nObjs <= pObj)) goto LAB_0072de32;
    if (((p->pMuxes != (uint *)0x0) &&
        (p->pMuxes[(int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555] != 0)) ||
       ((1 < p->pRefs[(int)((ulong)((long)pObj - (long)pGVar1) >> 2) * -0x55555555] ||
        (100 < p->vSuper->nSize)))) goto LAB_0072ddf0;
    Gia_ManSuperCollectAnd_rec
              (p,(Gia_Obj_t *)
                 ((ulong)(uVar5 >> 0x1d & 1) ^ (ulong)(pObj + -(ulong)(uVar5 & 0x1fffffff))));
    uVar5 = (uint)((ulong)*(undefined8 *)pObj >> 0x20);
    pObj = (Gia_Obj_t *)((ulong)(uVar5 >> 0x1d & 1) ^ (ulong)(pObj + -(ulong)(uVar5 & 0x1fffffff)));
    uVar2 = (ulong)pObj & 1;
  }
  iVar6 = 1;
LAB_0072ddf0:
  pGVar4 = (Gia_Obj_t *)((ulong)pObj & 0xfffffffffffffffe);
  pGVar1 = p->pObjs;
  if ((pGVar1 <= pGVar4) && (pGVar4 < pGVar1 + p->nObjs)) {
    iVar3 = (int)((ulong)((long)pGVar4 - (long)pGVar1) >> 2);
    if (-1 < iVar3 * -0x55555555) {
      Vec_IntPush(p->vSuper,iVar6 + iVar3 * 0x55555556);
      return;
    }
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                  ,0x10b,"int Abc_Var2Lit(int, int)");
  }
LAB_0072de32:
  __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
}

Assistant:

static inline void Gia_ManSuperCollectAnd_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( Gia_IsComplement(pObj) || 
        !Gia_ObjIsAndReal(p, pObj) || 
//        Gia_ObjRefNum(p, pObj) > 1 || 
        Gia_ObjRefNum(p, pObj) > 3 || 
//        (Gia_ObjRefNum(p, pObj) == 2 && (Gia_ObjRefNum(p, Gia_ObjFanin0(pObj)) == 1 || Gia_ObjRefNum(p, Gia_ObjFanin1(pObj)) == 1)) || 
        Vec_IntSize(p->vSuper) > BAL_SUPER )
    {
        Vec_IntPush( p->vSuper, Gia_ObjToLit(p, pObj) );
        return;
    }
    Gia_ManSuperCollectAnd_rec( p, Gia_ObjChild0(pObj) );
    Gia_ManSuperCollectAnd_rec( p, Gia_ObjChild1(pObj) );
}